

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

void __thiscall testing::internal::DeathTestImpl::ReadAndInterpretStatusByte(DeathTestImpl *this)

{
  int iVar1;
  uint uVar2;
  ssize_t sVar3;
  int *piVar4;
  ostream *poVar5;
  int iVar6;
  char flag;
  allocator<char> local_221;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  int local_1dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  char buffer [256];
  
  do {
    sVar3 = read(this->read_fd_,&flag,1);
    iVar1 = (int)sVar3;
    if (iVar1 != -1) {
      if (iVar1 == 0) {
        this->outcome_ = DIED;
        goto LAB_002e39b2;
      }
      if (iVar1 == 1) {
        if (flag == 'I') {
          iVar1 = this->read_fd_;
          Message::Message((Message *)&local_1d8);
          goto LAB_002e3aea;
        }
        if (flag == 'L') {
          this->outcome_ = LIVED;
        }
        else if (flag == 'T') {
          this->outcome_ = THREW;
        }
        else if (flag == 'R') {
          this->outcome_ = RETURNED;
        }
        else {
          GTestLog::GTestLog((GTestLog *)buffer,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/googletest/googletest/src/gtest-death-test.cc"
                             ,0x1ee);
          poVar5 = std::operator<<((ostream *)&std::cerr,"Death test child process reported ");
          poVar5 = std::operator<<(poVar5,"unexpected status byte (");
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::operator<<(poVar5,")");
          GTestLog::~GTestLog((GTestLog *)buffer);
        }
        goto LAB_002e39b2;
      }
      break;
    }
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  GTestLog::GTestLog((GTestLog *)&local_220,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/googletest/googletest/src/gtest-death-test.cc"
                     ,499);
  poVar5 = std::operator<<((ostream *)&std::cerr,"Read from death test child process failed: ");
  GetLastErrnoDescription_abi_cxx11_();
  std::operator<<(poVar5,(string *)buffer);
  std::__cxx11::string::~string((string *)buffer);
  GTestLog::~GTestLog((GTestLog *)&local_220);
  goto LAB_002e39b2;
  while( true ) {
    piVar4 = __errno_location();
    iVar6 = *piVar4;
    if (iVar6 != 4) break;
LAB_002e3aea:
    while( true ) {
      sVar3 = read(iVar1,buffer,0xff);
      uVar2 = (uint)sVar3;
      if ((int)uVar2 < 1) break;
      buffer[uVar2 & 0x7fffffff] = '\0';
      std::operator<<((ostream *)(local_1d8._M_dataplus._M_p + 0x10),buffer);
    }
    if (uVar2 != 0xffffffff) {
      if (uVar2 == 0) {
        GTestLog::GTestLog((GTestLog *)&local_200,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/googletest/googletest/src/gtest-death-test.cc"
                           ,0x16b);
        StringStreamToString(&local_220,(stringstream *)local_1d8._M_dataplus._M_p);
        std::operator<<((ostream *)&std::cerr,(string *)&local_220);
        goto LAB_002e3c4d;
      }
      piVar4 = __errno_location();
      iVar6 = *piVar4;
      break;
    }
  }
  GTestLog::GTestLog((GTestLog *)&local_200,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/googletest/googletest/src/gtest-death-test.cc"
                     ,0x16e);
  poVar5 = std::operator<<((ostream *)&std::cerr,"Error while reading death test internal: ");
  GetLastErrnoDescription_abi_cxx11_();
  poVar5 = std::operator<<(poVar5,(string *)&local_220);
  poVar5 = std::operator<<(poVar5," [");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar6);
  std::operator<<(poVar5,"]");
LAB_002e3c4d:
  std::__cxx11::string::~string((string *)&local_220);
  GTestLog::~GTestLog((GTestLog *)&local_200);
  if ((stringstream *)local_1d8._M_dataplus._M_p != (stringstream *)0x0) {
    (**(code **)(*(long *)local_1d8._M_dataplus._M_p + 8))(local_1d8._M_dataplus._M_p);
  }
LAB_002e39b2:
  do {
    iVar1 = close(this->read_fd_);
    if (iVar1 != -1) goto LAB_002e3a9c;
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"CHECK failed: File ",&local_221);
  std::operator+(&local_178,&local_198,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/googletest/googletest/src/gtest-death-test.cc"
                );
  std::operator+(&local_158,&local_178,", line ");
  local_1dc = 0x1f6;
  StreamableToString<int>(&local_1b8,&local_1dc);
  std::operator+(&local_200,&local_158,&local_1b8);
  std::operator+(&local_1d8,&local_200,": ");
  std::operator+(&local_220,&local_1d8,"posix::Close(read_fd())");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,
                 &local_220," != -1");
  DeathTestAbort((string *)buffer);
LAB_002e3a9c:
  this->read_fd_ = -1;
  return;
}

Assistant:

void DeathTestImpl::ReadAndInterpretStatusByte() {
  char flag;
  int bytes_read;

  // The read() here blocks until data is available (signifying the
  // failure of the death test) or until the pipe is closed (signifying
  // its success), so it's okay to call this in the parent before
  // the child process has exited.
  do {
    bytes_read = posix::Read(read_fd(), &flag, 1);
  } while (bytes_read == -1 && errno == EINTR);

  if (bytes_read == 0) {
    set_outcome(DIED);
  } else if (bytes_read == 1) {
    switch (flag) {
      case kDeathTestReturned:
        set_outcome(RETURNED);
        break;
      case kDeathTestThrew:
        set_outcome(THREW);
        break;
      case kDeathTestLived:
        set_outcome(LIVED);
        break;
      case kDeathTestInternalError:
        FailFromInternalError(read_fd());  // Does not return.
        break;
      default:
        GTEST_LOG_(FATAL) << "Death test child process reported "
                          << "unexpected status byte ("
                          << static_cast<unsigned int>(flag) << ")";
    }
  } else {
    GTEST_LOG_(FATAL) << "Read from death test child process failed: "
                      << GetLastErrnoDescription();
  }
  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Close(read_fd()));
  set_read_fd(-1);
}